

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

xcb_void_cookie_t
xcb_input_xi_set_client_pointer
          (xcb_connection_t *c,xcb_window_t window,xcb_input_device_id_t deviceid)

{
  uint uVar1;
  long in_FS_OFFSET;
  undefined4 local_54;
  xcb_window_t local_50;
  xcb_input_device_id_t local_4c;
  undefined2 local_4a;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined4 *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &local_54;
  local_54 = 0xaaaaaaaa;
  local_4a = 0;
  local_20 = 0xc;
  local_18 = 0;
  uStack_10 = 0;
  local_50 = window;
  local_4c = deviceid;
  uVar1 = xcb_send_request(c,0,&local_28,&xcb_input_xi_set_client_pointer::xcb_req);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (xcb_void_cookie_t)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

xcb_void_cookie_t
xcb_input_xi_set_client_pointer (xcb_connection_t      *c,
                                 xcb_window_t           window,
                                 xcb_input_device_id_t  deviceid)
{
    static const xcb_protocol_request_t xcb_req = {
        .count = 2,
        .ext = &xcb_input_id,
        .opcode = XCB_INPUT_XI_SET_CLIENT_POINTER,
        .isvoid = 1
    };

    struct iovec xcb_parts[4];
    xcb_void_cookie_t xcb_ret;
    xcb_input_xi_set_client_pointer_request_t xcb_out;

    xcb_out.window = window;
    xcb_out.deviceid = deviceid;
    memset(xcb_out.pad0, 0, 2);

    xcb_parts[2].iov_base = (char *) &xcb_out;
    xcb_parts[2].iov_len = sizeof(xcb_out);
    xcb_parts[3].iov_base = 0;
    xcb_parts[3].iov_len = -xcb_parts[2].iov_len & 3;

    xcb_ret.sequence = xcb_send_request(c, 0, xcb_parts + 2, &xcb_req);
    return xcb_ret;
}